

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int handle_hello_retry_request
              (ptls_t *tls,ptls_message_emitter_t *emitter,st_ptls_server_hello_t *sh,
              ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  _func_int_st_ptls_key_exchange_context_t_ptr_ptr_int_ptls_iovec_t_ptr_ptls_iovec_t *p_Var1;
  int iVar2;
  ptls_iovec_t pVar3;
  ptls_key_exchange_algorithm_t **local_58;
  ptls_key_exchange_algorithm_t **cand;
  int ret;
  ptls_handshake_properties_t *properties_local;
  st_ptls_server_hello_t *sh_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  if ((tls->field_20).client.key_share_ctx != (ptls_key_exchange_context_t *)0x0) {
    p_Var1 = ((tls->field_20).client.key_share_ctx)->on_exchange;
    pVar3 = ptls_iovec_init((void *)0x0,0);
    (*p_Var1)(&(tls->field_20).client.key_share_ctx,1,(ptls_iovec_t *)0x0,pVar3);
    (tls->field_20).client.key_share_ctx = (ptls_key_exchange_context_t *)0x0;
  }
  if (((tls->field_20).server.pending_traffic_secret[0x28] >> 1 & 1) != 0) {
    if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
      if ((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) {
        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0x892,
                      "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      ptls_aead_free((tls->traffic_protection).enc.aead);
      (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
    }
    (tls->field_20).server.pending_traffic_secret[0x28] =
         (tls->field_20).server.pending_traffic_secret[0x28] & 0xfd;
  }
  if ((sh->field_3).retry_request.selected_group == 0xffff) {
    if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
      return 0x2f;
    }
  }
  else {
    for (local_58 = tls->ctx->key_exchanges;
        (*local_58 != (ptls_key_exchange_algorithm_t *)0x0 &&
        ((*local_58)->id != (sh->field_3).retry_request.selected_group)); local_58 = local_58 + 1) {
    }
    if (*local_58 == (ptls_key_exchange_algorithm_t *)0x0) {
      return 0x2f;
    }
    tls->key_share = *local_58;
  }
  key_schedule_transform_post_ch1hash(tls->key_schedule);
  ptls__key_schedule_update_hash(tls->key_schedule,message.base,message.len);
  iVar2 = send_client_hello(tls,emitter,properties,&(sh->field_3).retry_request.cookie);
  return iVar2;
}

Assistant:

static int handle_hello_retry_request(ptls_t *tls, ptls_message_emitter_t *emitter, struct st_ptls_server_hello_t *sh,
                                      ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    int ret;

    if (tls->client.key_share_ctx != NULL) {
        tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        tls->client.key_share_ctx = NULL;
    }
    if (tls->client.using_early_data) {
        /* release traffic encryption key so that 2nd CH goes out in cleartext, but keep the epoch at 1 since we've already called
         * derive-secret */
        if (tls->ctx->update_traffic_key == NULL) {
            assert(tls->traffic_protection.enc.aead != NULL);
            ptls_aead_free(tls->traffic_protection.enc.aead);
            tls->traffic_protection.enc.aead = NULL;
        }
        tls->client.using_early_data = 0;
    }

    if (sh->retry_request.selected_group != UINT16_MAX) {
        /* we offer the first key_exchanges[0] as KEY_SHARE unless client.negotiate_before_key_exchange is set */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == sh->retry_request.selected_group)
                break;
        if (*cand == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        tls->key_share = *cand;
    } else if (tls->key_share != NULL) {
        /* retain the key-share using in first CH, if server does not specify one */
    } else {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    key_schedule_transform_post_ch1hash(tls->key_schedule);
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    ret = send_client_hello(tls, emitter, properties, &sh->retry_request.cookie);

Exit:
    return ret;
}